

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O2

int DoJumpIfCloser(AActor *target,VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,
                  int numret)

{
  BlockHeader *pBVar1;
  double dVar2;
  char cVar3;
  bool bVar4;
  undefined4 in_register_0000000c;
  VMReturn *this;
  uint uVar5;
  char *pcVar6;
  int iVar7;
  FState *state;
  BlockHeader *val;
  AActor *this_00;
  double dVar8;
  
  iVar7 = (int)ret;
  this = (VMReturn *)CONCAT44(in_register_0000000c,numparam);
  if (*(char *)((long)&stack->UnusedBlocks + 4) != '\x03') {
LAB_005b2af0:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_005b2af7:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4db,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  this_00 = (AActor *)stack->Blocks;
  if (*(int *)&stack->UnusedBlocks == 1) {
    if (this_00 == (AActor *)0x0) goto LAB_005b295a;
    bVar4 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
    if (!bVar4) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005b2af7;
    }
  }
  else {
    if (this_00 != (AActor *)0x0) goto LAB_005b2af0;
LAB_005b295a:
    this_00 = (AActor *)0x0;
  }
  uVar5 = (uint)param;
  if ((int)uVar5 < 2) {
    pcVar6 = "(paramnum) < numparam";
LAB_005b2b1f:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4dc,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if (*(char *)((long)&stack[1].UnusedBlocks + 4) != '\x01') {
    pcVar6 = "param[paramnum].Type == REGT_FLOAT";
    goto LAB_005b2b1f;
  }
  if (uVar5 == 2) {
    pcVar6 = "(paramnum) < numparam";
LAB_005b2b3e:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x4dd,
                  "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  if ((*(char *)((long)&stack[2].UnusedBlocks + 4) != '\x03') ||
     (val = stack[2].Blocks, val != (BlockHeader *)0x0 && *(int *)&stack[2].UnusedBlocks != 7)) {
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATE || param[paramnum].a == NULL)"
    ;
    goto LAB_005b2b3e;
  }
  pBVar1 = stack[1].Blocks;
  if (uVar5 < 4) {
LAB_005b29be:
    bVar4 = false;
  }
  else {
    cVar3 = *(char *)((long)&stack[3].UnusedBlocks + 4);
    if (cVar3 != '\0') {
      if (cVar3 != -1) {
        __assert_fail("param[paramnum].Type == REGT_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x4de,
                      "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      goto LAB_005b29be;
    }
    bVar4 = *(int *)&stack[3].Blocks != 0;
  }
  if (target == (AActor *)0x0) {
    if (iVar7 < 1) {
      return 0;
    }
    if (this == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x4e2,
                    "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  else {
    dVar8 = AActor::Distance2D(this_00,target,false);
    if (dVar8 < (double)pBVar1) {
      if (!bVar4) {
        dVar8 = (this_00->__Pos).Z;
        dVar2 = (target->__Pos).Z;
        if (((dVar8 <= dVar2) || ((double)pBVar1 <= dVar8 - (target->Height + dVar2))) &&
           ((dVar2 < dVar8 || ((double)pBVar1 <= dVar2 - (dVar8 + this_00->Height)))))
        goto LAB_005b2aaf;
      }
      if (iVar7 < 1) {
        return 0;
      }
      if (this == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                      ,0x4e9,
                      "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)"
                     );
      }
      goto LAB_005b2ac4;
    }
LAB_005b2aaf:
    if (iVar7 < 1) {
      return 0;
    }
    if (this == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                    ,0x4eb,
                    "int DoJumpIfCloser(AActor *, VMFrameStack *, VMValue *, int, VMReturn *, int)")
      ;
    }
  }
  val = (BlockHeader *)0x0;
LAB_005b2ac4:
  VMReturn::SetPointer(this,val,7);
  return 1;
}

Assistant:

static int DoJumpIfCloser(AActor *target, VM_ARGS)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT	(dist);
	PARAM_STATE	(jump);
	PARAM_BOOL_OPT(noz) { noz = false; }

	if (!target)
	{ // No target - no jump
		ACTION_RETURN_STATE(NULL);
	}
	if (self->Distance2D(target) < dist &&
		(noz || 
		((self->Z() > target->Z() && self->Z() - target->Top() < dist) ||
		(self->Z() <= target->Z() && target->Z() - self->Top() < dist))))
	{
		ACTION_RETURN_STATE(jump);
	}
	ACTION_RETURN_STATE(NULL);
}